

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

uint add_not_list_to_class
               (uint8_t *classbits,PCRE2_UCHAR16 **uchardptr,uint32_t options,compile_block_16 *cb,
               uint32_t *p)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint32_t end;
  
  uVar4 = 0;
  if (*p != 0) {
    uVar4 = *p - 1;
    cb->class_range_start = 0;
    cb->class_range_end = uVar4;
    uVar1 = add_to_class_internal(classbits,uchardptr,options,cb,0,uVar4);
    uVar4 = *p;
    if (uVar4 == 0xffffffff) {
      return uVar1;
    }
  }
  puVar3 = p + 1;
  do {
    uVar2 = *puVar3;
    uVar4 = uVar4 + 1;
    if (uVar2 != uVar4) {
      end = uVar2 - 1;
      if (uVar2 == 0xffffffff) {
        end = ((options >> 0x13 & 1) != 0) - 1 | 0x10ffff;
      }
      cb->class_range_start = uVar4;
      cb->class_range_end = end;
      add_to_class_internal(classbits,uchardptr,options,cb,uVar4,end);
      uVar2 = *puVar3;
      if (uVar2 == 0xffffffff) {
        return 0xffffffff;
      }
    }
    puVar3 = puVar3 + 1;
    uVar4 = uVar2;
  } while( true );
}

Assistant:

static unsigned int
add_not_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, compile_block *cb, const uint32_t *p)
{
BOOL utf = (options & PCRE2_UTF) != 0;
unsigned int n8 = 0;
if (p[0] > 0)
  n8 += add_to_class(classbits, uchardptr, options, cb, 0, p[0] - 1);
while (p[0] < NOTACHAR)
  {
  while (p[1] == p[0] + 1) p++;
  n8 += add_to_class(classbits, uchardptr, options, cb, p[0] + 1,
    (p[1] == NOTACHAR) ? (utf ? 0x10ffffu : 0xffffffffu) : p[1] - 1);
  p++;
  }
return n8;
}